

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

int __thiscall
glcts::ExplicitUniformLocationES31Tests::init
          (ExplicitUniformLocationES31Tests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestSubcase *pTVar1;
  
  context = (this->super_TestCaseGroup).m_context;
  glcts::(anonymous_namespace)::Logger::s_tcuLog = context->m_testCtx->m_log;
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,context,"uniform-loc",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLoc>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-nondecimal",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocNonDec>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-all-stages",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocMultipleStages>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-multiple-uniforms",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocMultipleUniforms>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-types-mix",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocTypesMix>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-types-mat",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocTypesMat>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-types-structs",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocTypesStructs>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-types-samplers",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocTypesSamplers>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-arrays-nonspaced",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocArraysNonSpaced>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-arrays-spaced",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocArraySpaced>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-arrays-of-arrays",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocArrayofArrays>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-mix-with-implicit",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocMixWithImplicit>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-mix-with-implicit2",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocMixWithImplicit2>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-mix-with-implicit3",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocMixWithImplicit3>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-mix-with-implicit-max",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocMixWithImplicitMax>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-mix-with-implicit-max-array",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocMixWithImplicitMaxArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-implicit-in-some-stages",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::UniformLocImplicitInSomeStages>
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-implicit-in-some-stages2",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocImplicitInSomeStages2>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-implicit-in-some-stages3",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocImplicitInSomeStages3>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform-loc-negative-compile-non-number-literal",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocNegativeCompileNonNumberLiteral>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform-loc-negative-compile-nonconst-loc",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocNegativeCompileNonConstLoc>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform-loc-negative-link-location-reused1",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocNegativeLinkLocationReused1>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform-loc-negative-link-location-reused2",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocNegativeLinkLocationReused2>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-loc-negative-link-max-location",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocNegativeLinkMaxLocation>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform-loc-negative-link-max-num-of-locations",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::UniformLocNegativeLinkMaxMaxNumOfLocation>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void ExplicitUniformLocationES31Tests::init()
{
	using namespace glcts;
	Logger::setOutput(m_context.getTestContext().getLog());
	addChild(new TestSubcase(m_context, "uniform-loc", TestSubcase::Create<UniformLoc>));
	addChild(new TestSubcase(m_context, "uniform-loc-nondecimal", TestSubcase::Create<UniformLocNonDec>));
	addChild(new TestSubcase(m_context, "uniform-loc-all-stages", TestSubcase::Create<UniformLocMultipleStages>));
	addChild(
		new TestSubcase(m_context, "uniform-loc-multiple-uniforms", TestSubcase::Create<UniformLocMultipleUniforms>));
	addChild(new TestSubcase(m_context, "uniform-loc-types-mix", TestSubcase::Create<UniformLocTypesMix>));
	addChild(new TestSubcase(m_context, "uniform-loc-types-mat", TestSubcase::Create<UniformLocTypesMat>));
	addChild(new TestSubcase(m_context, "uniform-loc-types-structs", TestSubcase::Create<UniformLocTypesStructs>));
	addChild(new TestSubcase(m_context, "uniform-loc-types-samplers", TestSubcase::Create<UniformLocTypesSamplers>));
	addChild(
		new TestSubcase(m_context, "uniform-loc-arrays-nonspaced", TestSubcase::Create<UniformLocArraysNonSpaced>));
	addChild(new TestSubcase(m_context, "uniform-loc-arrays-spaced", TestSubcase::Create<UniformLocArraySpaced>));
	addChild(new TestSubcase(m_context, "uniform-loc-arrays-of-arrays", TestSubcase::Create<UniformLocArrayofArrays>));
	addChild(
		new TestSubcase(m_context, "uniform-loc-mix-with-implicit", TestSubcase::Create<UniformLocMixWithImplicit>));
	addChild(
		new TestSubcase(m_context, "uniform-loc-mix-with-implicit2", TestSubcase::Create<UniformLocMixWithImplicit2>));
	addChild(
		new TestSubcase(m_context, "uniform-loc-mix-with-implicit3", TestSubcase::Create<UniformLocMixWithImplicit3>));
	addChild(new TestSubcase(m_context, "uniform-loc-mix-with-implicit-max",
							 TestSubcase::Create<UniformLocMixWithImplicitMax>));
	addChild(new TestSubcase(m_context, "uniform-loc-mix-with-implicit-max-array",
							 TestSubcase::Create<UniformLocMixWithImplicitMaxArray>));
	addChild(new TestSubcase(m_context, "uniform-loc-implicit-in-some-stages",
							 TestSubcase::Create<UniformLocImplicitInSomeStages>));
	addChild(new TestSubcase(m_context, "uniform-loc-implicit-in-some-stages2",
							 TestSubcase::Create<UniformLocImplicitInSomeStages2>));
	addChild(new TestSubcase(m_context, "uniform-loc-implicit-in-some-stages3",
							 TestSubcase::Create<UniformLocImplicitInSomeStages3>));
	addChild(new TestSubcase(m_context, "uniform-loc-negative-compile-non-number-literal",
							 TestSubcase::Create<UniformLocNegativeCompileNonNumberLiteral>));
	addChild(new TestSubcase(m_context, "uniform-loc-negative-compile-nonconst-loc",
							 TestSubcase::Create<UniformLocNegativeCompileNonConstLoc>));
	addChild(new TestSubcase(m_context, "uniform-loc-negative-link-location-reused1",
							 TestSubcase::Create<UniformLocNegativeLinkLocationReused1>));
	addChild(new TestSubcase(m_context, "uniform-loc-negative-link-location-reused2",
							 TestSubcase::Create<UniformLocNegativeLinkLocationReused2>));
	addChild(new TestSubcase(m_context, "uniform-loc-negative-link-max-location",
							 TestSubcase::Create<UniformLocNegativeLinkMaxLocation>));
	addChild(new TestSubcase(m_context, "uniform-loc-negative-link-max-num-of-locations",
							 TestSubcase::Create<UniformLocNegativeLinkMaxMaxNumOfLocation>));
}